

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  int iVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  string sStack_1f8;
  cmListFileArgument a;
  ostringstream m;
  
  std::__cxx11::string::string((string *)&m,token->text,(allocator *)&sStack_1f8);
  iVar1 = token->line;
  std::__cxx11::string::string((string *)&a,(string *)&m);
  a.Delim = delim;
  a.Line = (long)iVar1;
  std::__cxx11::string::~string((string *)&m);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
            (&(this->Function).Arguments,&a);
  if (this->Separation == SeparationOkay) {
    bVar2 = true;
  }
  else {
    bVar5 = this->Separation != SeparationError;
    bVar6 = delim != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
    poVar4 = std::operator<<((ostream *)&m,"Syntax ");
    bVar2 = bVar6 && bVar5;
    pcVar3 = "CMake Error";
    if (bVar6 && bVar5) {
      pcVar3 = "CMake Warning";
    }
    poVar4 = std::operator<<(poVar4,pcVar3 + 6);
    poVar4 = std::operator<<(poVar4," in cmake code at\n");
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,this->FileName);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,token->line);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,token->column);
    poVar4 = std::operator<<(poVar4,"\n");
    std::operator<<(poVar4,"Argument not separated from preceding token by whitespace.");
    this_00 = this->Makefile;
    if (bVar6 && bVar5) {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&sStack_1f8);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_1f8);
    }
    std::__cxx11::string::~string((string *)&sStack_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
  }
  std::__cxx11::string::~string((string *)&a);
  return bVar2;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  cmListFileArgument a(token->text, delim, token->line);
  this->Function.Arguments.push_back(a);
  if(this->Separation == SeparationOkay)
    {
    return true;
    }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  m << "Syntax " << (isError? "Error":"Warning") << " in cmake code at\n"
    << "  " << this->FileName << ":" << token->line << ":"
    << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  if(isError)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }
  else
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    return true;
    }
}